

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAnalytic_mels.c
# Opt level: O0

int MatrixEmbeddedLSSolve(SUNLinearSolver LS,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol)

{
  int iVar1;
  long *in_RCX;
  long *in_RDX;
  undefined8 *in_RDI;
  sunrealtype lamda;
  sunrealtype *rdata;
  void *user_data;
  sunrealtype rl1;
  sunrealtype gamma;
  sunrealtype tcur;
  N_Vector zn1;
  N_Vector fn;
  N_Vector ypred;
  N_Vector y;
  int retval;
  char *funcname;
  double **returnvalue;
  double *local_78;
  undefined1 local_70 [8];
  double local_68;
  undefined1 local_60 [8];
  char local_58 [8];
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  undefined1 local_40 [12];
  undefined4 local_34;
  long *local_28;
  long *local_20;
  int local_4;
  
  funcname = local_58;
  returnvalue = &local_78;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_34 = CVodeGetNonlinearSystemData(*in_RDI,local_60,local_48,local_40,local_50,&local_68);
  iVar1 = check_retval(returnvalue,funcname,(int)((ulong)local_70 >> 0x20));
  if (iVar1 == 0) {
    **(double **)(*local_20 + 0x10) =
         **(double **)(*local_28 + 0x10) / (-local_68 * *local_78 + 1.0);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int MatrixEmbeddedLSSolve(SUNLinearSolver LS, SUNMatrix A, N_Vector x,
                                 N_Vector b, sunrealtype tol)
{
  /* temporary variables */
  int retval;
  N_Vector y, ypred, fn, zn1;
  sunrealtype tcur, gamma, rl1;
  void* user_data;
  sunrealtype* rdata;
  sunrealtype lamda;

  /* retrieve implicit system data from CVode */
  retval = CVodeGetNonlinearSystemData(LS->content, &tcur, &ypred, &y, &fn,
                                       &gamma, &rl1, &zn1, &user_data);
  if (check_retval((void*)&retval, "CVodeGetNonlinearSystemData", 1))
  {
    return (-1);
  }

  /* extract stiffness parameter from user_data */
  rdata = (sunrealtype*)user_data;
  lamda = rdata[0];

  /* perform linear solve: (1-gamma*lamda)*x = b */
  NV_Ith_S(x, 0) = NV_Ith_S(b, 0) / (1 - gamma * lamda);

  /* return with success */
  return (SUN_SUCCESS);
}